

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void PPC_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x60) == 3) {
    pcVar1 = strrchr(in_RDX,0x2b);
    if ((pcVar1 == (char *)0x0) || (pcVar1 = strstr(in_RDX,".+"), pcVar1 != (char *)0x0)) {
      pcVar1 = strrchr(in_RDX,0x2d);
      if (pcVar1 != (char *)0x0) {
        *(undefined4 *)(*(long *)(in_RSI + 0xf0) + 0x5c) = 2;
      }
    }
    else {
      *(undefined4 *)(*(long *)(in_RSI + 0xf0) + 0x5c) = 1;
    }
  }
  return;
}

Assistant:

void PPC_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn has branch hint
	if (strrchr(insn_asm, '+') != NULL && !strstr(insn_asm, ".+")) {
		insn->detail->ppc.bh = PPC_BH_PLUS;
	} else if (strrchr(insn_asm, '-') != NULL) {
		insn->detail->ppc.bh = PPC_BH_MINUS;
	}
}